

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

float noise_pink(noise_segment_data *data)

{
  long lVar1;
  float fVar2;
  uint local_28;
  int local_24;
  int n;
  int zeroes;
  int64_t sum;
  int64_t random;
  noise_segment_data *data_local;
  
  data->pink_index = data->pink_index + 1U & data->pink_index_mask;
  if (data->pink_index != 0) {
    local_24 = 0;
    for (local_28 = data->pink_index; (local_28 & 1) == 0; local_28 = (int)local_28 >> 1) {
      local_24 = local_24 + 1;
    }
    data->pink_running_sum = data->pink_running_sum - data->pink_rows[local_24];
    fVar2 = mixed_random();
    lVar1 = (long)((fVar2 - 0.5) * 67108864.0);
    data->pink_running_sum = lVar1 + data->pink_running_sum;
    data->pink_rows[local_24] = lVar1;
  }
  fVar2 = mixed_random();
  return data->pink_scalar * (float)(data->pink_running_sum + (long)((fVar2 - 0.5) * 67108864.0));
}

Assistant:

float noise_pink(struct noise_segment_data *data){
  int64_t random;
  int64_t sum;

  data->pink_index = (data->pink_index + 1) & data->pink_index_mask;

  if(data->pink_index != 0) {
    int zeroes = 0;
    int n = data->pink_index;
    while((n & 1) == 0){
      n = n >> 1;
      zeroes++;
    }

    data->pink_running_sum -= data->pink_rows[zeroes];
    random = (mixed_random()-0.5)*67108864;
    data->pink_running_sum += random;
    data->pink_rows[zeroes] = random;
  }
  
  random = (mixed_random()-0.5)*67108864;
  sum = data->pink_running_sum + random;

  return data->pink_scalar * sum;
}